

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.cc
# Opt level: O3

int64 google::protobuf::util::TimeUtil::DurationToMilliseconds(Duration *duration)

{
  int iVar1;
  
  iVar1 = duration->nanos_;
  return duration->seconds_ * 1000 + (long)(iVar1 / 1000000) +
         (ulong)(0 < iVar1 % 1000000 && iVar1 < -999999);
}

Assistant:

int64 TimeUtil::DurationToMilliseconds(const Duration& duration) {
  return duration.seconds() * kMillisPerSecond +
         RoundTowardZero(duration.nanos(), kNanosPerMillisecond);
}